

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O1

void __thiscall TrodesMsg::TrodesMsg(TrodesMsg *this,TrodesMsg *t)

{
  (this->format)._M_dataplus._M_p = (pointer)&(this->format).field_2;
  (this->format)._M_string_length = 0;
  (this->format).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  this->msg = t->msg;
  t->msg = (zmsg_t *)0x0;
  return;
}

Assistant:

TrodesMsg::TrodesMsg(TrodesMsg&& t) {
    //TODO: find out if msg can be safely deallocated IF it cannot be guarenteed that it is already a NULL ptr
    format = t.format;
    msg = t.msg;
    t.msg = NULL;
}